

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O1

bool __thiscall EventHandler::povMoved(EventHandler *this,JoyStickEvent *arg,int pov)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  poVar2 = (ostream *)std::ostream::flush();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)(*(long *)(arg + 8) + 8),*(long *)(*(long *)(arg + 8) + 0x10)
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,". POV",5);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pov);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  lVar4 = (long)pov;
  uVar1 = *(uint *)(*(long *)(arg + 0x10) + 0x44 + lVar4 * 8);
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 0x10) != 0) {
      pcVar3 = "South";
      goto LAB_00105c28;
    }
  }
  else {
    pcVar3 = "North";
LAB_00105c28:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,5);
  }
  uVar1 = *(uint *)(*(long *)(arg + 0x10) + 0x44 + lVar4 * 8);
  if ((uVar1 >> 8 & 1) == 0) {
    if ((uVar1 >> 0xc & 1) == 0) goto LAB_00105c6f;
    pcVar3 = "West";
  }
  else {
    pcVar3 = "East";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,4);
LAB_00105c6f:
  if (*(int *)(*(long *)(arg + 0x10) + 0x44 + lVar4 * 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Centered",8);
  }
  return true;
}

Assistant:

bool povMoved(const JoyStickEvent& arg, int pov)
	{
		std::cout << std::endl
				  << arg.device->vendor() << ". POV" << pov << " ";

		if(arg.state.mPOV[pov].direction & Pov::North) //Going up
			std::cout << "North";
		else if(arg.state.mPOV[pov].direction & Pov::South) //Going down
			std::cout << "South";

		if(arg.state.mPOV[pov].direction & Pov::East) //Going right
			std::cout << "East";
		else if(arg.state.mPOV[pov].direction & Pov::West) //Going left
			std::cout << "West";

		if(arg.state.mPOV[pov].direction == Pov::Centered) //stopped/centered out
			std::cout << "Centered";
		return true;
	}